

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O1

void Sfm_ParSetDefault(Sfm_Par_t *pPars)

{
  pPars->nTfoLevMax = 0;
  pPars->nTfiLevMax = 0;
  pPars->nFanoutMax = 0;
  pPars->nDepthMax = 0;
  pPars->nWinSizeMax = 0;
  pPars->nGrowthLevel = 0;
  pPars->nBTLimit = 0;
  pPars->nNodesMax = 0;
  pPars->fRrOnly = 0;
  pPars->fArea = 0;
  pPars->fAreaRev = 0;
  pPars->fMoreEffort = 0;
  pPars->fLibVerbose = 0;
  pPars->fDelayVerbose = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  pPars->fUseAndOr = 0;
  pPars->fZeroCost = 0;
  pPars->fUseSim = 0;
  pPars->fPrintDecs = 0;
  pPars->iNodeOne = 0;
  pPars->nFirstFixed = 0;
  pPars->nTimeWin = 0;
  pPars->DeltaCrit = 0;
  pPars->nVarMax = 0;
  pPars->nMffcMin = 0;
  pPars->nMffcMax = 0;
  pPars->nDecMax = 0;
  pPars->nTfoLevMax = 2;
  pPars->nFanoutMax = 0x1e;
  pPars->nDepthMax = 0x14;
  pPars->nWinSizeMax = 300;
  pPars->nGrowthLevel = 0;
  pPars->nBTLimit = 5000;
  pPars->fRrOnly = 0;
  pPars->fArea = 0;
  pPars->fMoreEffort = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Setup parameter structure.]

  Description []

  SideEffects []

  SeeAlso     []

***********************************************************************/
void Sfm_ParSetDefault( Sfm_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Sfm_Par_t) );
    pPars->nTfoLevMax   =    2;  // the maximum fanout levels
    pPars->nFanoutMax   =   30;  // the maximum number of fanouts
    pPars->nDepthMax    =   20;  // the maximum depth to try  
    pPars->nWinSizeMax  =  300;  // the maximum window size
    pPars->nGrowthLevel =    0;  // the maximum allowed growth in level
    pPars->nBTLimit     = 5000;  // the maximum number of conflicts in one SAT run
    pPars->fRrOnly      =    0;  // perform redundancy removal
    pPars->fArea        =    0;  // performs optimization for area
    pPars->fMoreEffort  =    0;  // performs high-affort minimization
    pPars->fVerbose     =    0;  // enable basic stats
    pPars->fVeryVerbose =    0;  // enable detailed stats
}